

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenSwitchSetNameAt(BinaryenExpressionRef expr,BinaryenIndex index,char *name)

{
  long lVar1;
  IString *this;
  undefined1 in_CL;
  ulong uVar2;
  string_view sVar3;
  
  if (expr->_id != SwitchId) {
    __assert_fail("expression->is<Switch>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x86e,
                  "void BinaryenSwitchSetNameAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  uVar2 = (ulong)index;
  if (expr[1].type.id <= uVar2) {
    __assert_fail("index < static_cast<Switch*>(expression)->targets.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x86f,
                  "void BinaryenSwitchSetNameAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  if (name == (char *)0x0) {
    __assert_fail("name",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x870,
                  "void BinaryenSwitchSetNameAt(BinaryenExpressionRef, BinaryenIndex, const char *)"
                 );
  }
  this = (IString *)strlen(name);
  sVar3._M_str = (char *)0x0;
  sVar3._M_len = (size_t)name;
  sVar3 = wasm::IString::interned(this,sVar3,(bool)in_CL);
  if (uVar2 < expr[1].type.id) {
    lVar1 = *(long *)(expr + 1);
    *(size_t *)(lVar1 + uVar2 * 0x10) = sVar3._M_len;
    *(char **)(lVar1 + 8 + uVar2 * 0x10) = sVar3._M_str;
    return;
  }
  __assert_fail("index < usedElements",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                ,0xbc,
                "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
               );
}

Assistant:

void BinaryenSwitchSetNameAt(BinaryenExpressionRef expr,
                             BinaryenIndex index,
                             const char* name) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Switch>());
  assert(index < static_cast<Switch*>(expression)->targets.size());
  assert(name);
  static_cast<Switch*>(expression)->targets[index] = name;
}